

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuthorFileParser.hpp
# Opt level: O0

void __thiscall AuthorFileParser::writeAuthorList(AuthorFileParser *this,string *authorListFilename)

{
  string local_38 [32];
  string *local_18;
  string *authorListFilename_local;
  AuthorFileParser *this_local;
  
  local_18 = authorListFilename;
  authorListFilename_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)authorListFilename);
  BOWFileParser::writeWordList(&this->super_BOWFileParser,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void writeAuthorList(std::string authorListFilename)const{
        writeWordList(authorListFilename);
    }